

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reproxy.c
# Opt level: O2

void h2o_reproxy_register_configurator(h2o_globalconf_t *conf)

{
  h2o_configurator_t *configurator;
  
  configurator = h2o_configurator_create(conf,0x60);
  configurator[1]._link.next = (st_h2o_linklist_t *)&configurator[1]._link.prev;
  configurator->enter = on_config_enter;
  configurator->exit = on_config_exit;
  h2o_configurator_define_command(configurator,"reproxy",0x10f,on_config_reproxy);
  return;
}

Assistant:

void h2o_reproxy_register_configurator(h2o_globalconf_t *conf)
{
    struct reproxy_configurator_t *c = (void *)h2o_configurator_create(conf, sizeof(*c));

    /* set default vars */
    c->vars = c->_vars_stack;

    /* setup handlers */
    c->super.enter = on_config_enter;
    c->super.exit = on_config_exit;

    /* reproxy: ON | OFF */
    h2o_configurator_define_command(&c->super, "reproxy", H2O_CONFIGURATOR_FLAG_ALL_LEVELS | H2O_CONFIGURATOR_FLAG_EXPECT_SCALAR,
                                    on_config_reproxy);
}